

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.h
# Opt level: O0

Vector3fi * __thiscall pbrt::Transform::operator()(Transform *this,Vector3fi *v)

{
  float fVar1;
  Vector3f v_00;
  bool bVar2;
  float *pfVar3;
  Vector3fi *this_00;
  Vector3fi *in_RDI;
  span<const_float> *psVar4;
  float fVar6;
  float fVar5;
  float fVar7;
  float fVar8;
  double dVar9;
  undefined1 auVar10 [64];
  undefined1 auVar12 [56];
  Vector3f VVar13;
  Float zp;
  Float yp;
  Float xp;
  Vector3f vInError;
  Vector3f vOutError;
  Float z;
  Float y;
  Float x;
  int in_stack_fffffffffffffc5c;
  float x_00;
  undefined4 in_stack_fffffffffffffc60;
  undefined4 in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc80;
  undefined4 in_stack_fffffffffffffc84;
  size_t i;
  float in_stack_fffffffffffffc90;
  float in_stack_fffffffffffffca8;
  float in_stack_fffffffffffffcac;
  float in_stack_fffffffffffffcb0;
  span<const_float> local_2a0;
  span<const_float> local_290;
  span<const_float> local_280;
  float local_26c;
  span<const_float> local_268;
  span<const_float> local_258;
  span<const_float> local_248;
  float local_234;
  span<const_float> local_230;
  span<const_float> local_220;
  span<const_float> local_210;
  float local_1fc;
  span<const_float> local_1f8;
  span<const_float> local_1e8;
  span<const_float> local_1d8;
  span<const_float> local_1c8;
  span<const_float> local_1b8;
  span<const_float> local_1a8;
  span<const_float> local_198;
  span<const_float> local_188;
  span<const_float> local_178;
  span<const_float> local_168;
  span<const_float> local_158;
  span<const_float> local_148;
  span<const_float> local_138;
  span<const_float> local_128;
  span<const_float> local_118;
  span<const_float> local_108;
  span<const_float> local_f8;
  span<const_float> local_e8;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_c4;
  float local_bc;
  span<const_float> local_b8;
  span<const_float> local_a8;
  span<const_float> local_98;
  span<const_float> local_88;
  span<const_float> local_78;
  span<const_float> local_68;
  span<const_float> local_58;
  span<const_float> local_48;
  span<const_float> local_38;
  float local_28;
  float fStack_24;
  float local_20;
  Float local_1c;
  Float local_18;
  Float local_14;
  undefined1 auVar11 [64];
  undefined1 extraout_var [60];
  
  local_14 = Interval::operator_cast_to_float((Interval *)0x6dfe94);
  local_18 = Interval::operator_cast_to_float((Interval *)0x6dfeae);
  auVar10._0_4_ = Interval::operator_cast_to_float((Interval *)0x6dfec8);
  auVar10._4_60_ = extraout_var;
  local_1c = auVar10._0_4_;
  Vector3<float>::Vector3((Vector3<float> *)0x6dfede);
  bVar2 = Vector3fi::IsExact((Vector3fi *)
                             CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60));
  auVar12 = auVar10._8_56_;
  if (bVar2) {
    dVar9 = gamma(auVar10._0_8_);
    local_38 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_38;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_48 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_48;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar7 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_58 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_58;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar6 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    local_28 = SUB84(dVar9,0) * (fVar5 + fVar7 + fVar6);
    dVar9 = gamma((double)(ulong)(uint)local_28);
    local_68 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_68;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_78 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_78;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar7 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_88 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_88;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar6 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    fStack_24 = SUB84(dVar9,0) * (fVar5 + fVar7 + fVar6);
    dVar9 = gamma((double)(ulong)(uint)fStack_24);
    local_98 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_98;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_a8 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_a8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar7 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_b8 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_b8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar6 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    local_20 = SUB84(dVar9,0) * (fVar5 + fVar7 + fVar6);
  }
  else {
    VVar13 = Vector3fi::Error((Vector3fi *)
                              CONCAT44(in_stack_fffffffffffffc84,in_stack_fffffffffffffc80));
    local_d0 = VVar13.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar11._0_8_ = VVar13.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar11._8_56_ = auVar12;
    local_d8 = vmovlpd_avx(auVar11._0_16_);
    local_c4 = local_d8;
    local_bc = local_d0;
    dVar9 = gamma(auVar11._0_8_);
    local_e8 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_e8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3;
    std::abs((int)psVar4);
    fVar5 = fVar5 * (float)local_c4;
    local_f8 = SquareMatrix<4>::operator[]
                         ((SquareMatrix<4> *)
                          CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                          in_stack_fffffffffffffc5c);
    psVar4 = &local_f8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar7 = *pfVar3;
    std::abs((int)psVar4);
    fVar7 = fVar7 * local_c4._4_4_;
    local_108 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_108;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar6 = *pfVar3;
    std::abs((int)psVar4);
    in_stack_fffffffffffffcb0 = (SUB84(dVar9,0) + 1.0) * (fVar5 + fVar7 + fVar6 * local_bc);
    dVar9 = gamma((double)(ulong)(uint)in_stack_fffffffffffffcb0);
    in_stack_fffffffffffffcac = SUB84(dVar9,0);
    local_118 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_118;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    in_stack_fffffffffffffca8 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_128 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_128;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar5 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    in_stack_fffffffffffffca8 = in_stack_fffffffffffffca8 + fVar5;
    local_138 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_138;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar5 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    local_28 = in_stack_fffffffffffffcb0 +
               in_stack_fffffffffffffcac * (in_stack_fffffffffffffca8 + fVar5);
    dVar9 = gamma((double)(ulong)(uint)local_28);
    local_148 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_148;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3;
    std::abs((int)psVar4);
    fVar5 = fVar5 * (float)local_c4;
    local_158 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_158;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar7 = *pfVar3;
    std::abs((int)psVar4);
    fVar7 = fVar7 * local_c4._4_4_;
    local_168 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_168;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar6 = *pfVar3;
    std::abs((int)psVar4);
    fVar5 = (SUB84(dVar9,0) + 1.0) * (fVar5 + fVar7 + fVar6 * local_bc);
    dVar9 = gamma((double)(ulong)(uint)fVar5);
    local_178 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_178;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar7 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_188 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_188;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_198 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_198;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar8 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    fStack_24 = fVar5 + SUB84(dVar9,0) * (fVar7 + fVar6 + fVar8);
    dVar9 = gamma((double)(ulong)(uint)fStack_24);
    local_1a8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_1a8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar5 = *pfVar3;
    std::abs((int)psVar4);
    fVar5 = fVar5 * (float)local_c4;
    local_1b8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_1b8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar7 = *pfVar3;
    std::abs((int)psVar4);
    fVar7 = fVar7 * local_c4._4_4_;
    local_1c8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_1c8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar6 = *pfVar3;
    std::abs((int)psVar4);
    fVar5 = (SUB84(dVar9,0) + 1.0) * (fVar5 + fVar7 + fVar6 * local_bc);
    dVar9 = gamma((double)(ulong)(uint)fVar5);
    local_1d8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_1d8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,0);
    fVar7 = *pfVar3 * local_14;
    std::abs((int)psVar4);
    local_1e8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_1e8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,1);
    fVar6 = *pfVar3 * local_18;
    std::abs((int)psVar4);
    local_1f8 = SquareMatrix<4>::operator[]
                          ((SquareMatrix<4> *)
                           CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),
                           in_stack_fffffffffffffc5c);
    psVar4 = &local_1f8;
    pfVar3 = pstd::span<const_float>::operator[](psVar4,2);
    fVar8 = *pfVar3 * local_1c;
    std::abs((int)psVar4);
    local_20 = fVar5 + SUB84(dVar9,0) * (fVar7 + fVar6 + fVar8);
  }
  x_00 = 0.0;
  local_210 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),0);
  this_00 = (Vector3fi *)(ulong)(uint)x_00;
  pfVar3 = pstd::span<const_float>::operator[](&local_210,(size_t)this_00);
  fVar6 = *pfVar3 * local_14;
  local_220 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)
                         CONCAT44(in_stack_fffffffffffffc64,in_stack_fffffffffffffc60),(int)x_00);
  pfVar3 = pstd::span<const_float>::operator[](&local_220,1);
  fVar5 = fVar6 + *pfVar3 * local_18;
  local_230 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffc64,fVar5),(int)x_00);
  i = 2;
  pfVar3 = pstd::span<const_float>::operator[](&local_230,2);
  local_1fc = fVar5 + *pfVar3 * local_1c;
  local_248 = SquareMatrix<4>::operator[]
                        ((SquareMatrix<4> *)CONCAT44(in_stack_fffffffffffffc64,fVar5),(int)x_00);
  pfVar3 = pstd::span<const_float>::operator[](&local_248,(size_t)this_00);
  fVar8 = *pfVar3 * local_14;
  local_258 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar8,fVar5),(int)x_00);
  pfVar3 = pstd::span<const_float>::operator[](&local_258,1);
  fVar7 = fVar8 + *pfVar3 * local_18;
  local_268 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar8,fVar5),(int)x_00);
  pfVar3 = pstd::span<const_float>::operator[](&local_268,i);
  local_234 = fVar7 + *pfVar3 * local_1c;
  local_280 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar8,fVar5),(int)x_00);
  pfVar3 = pstd::span<const_float>::operator[](&local_280,(size_t)this_00);
  fVar7 = *pfVar3 * local_14;
  local_290 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar8,fVar5),(int)x_00);
  pfVar3 = pstd::span<const_float>::operator[](&local_290,1);
  fVar1 = *pfVar3 * local_18;
  local_2a0 = SquareMatrix<4>::operator[]((SquareMatrix<4> *)CONCAT44(fVar8,fVar5),(int)x_00);
  pfVar3 = pstd::span<const_float>::operator[](&local_2a0,i);
  local_26c = fVar7 + fVar1 + *pfVar3 * local_1c;
  Vector3<float>::Vector3((Vector3<float> *)CONCAT44(fVar8,fVar5),x_00,fVar6,0.0);
  v_00.super_Tuple3<pbrt::Vector3,_float>.y = in_stack_fffffffffffffcac;
  v_00.super_Tuple3<pbrt::Vector3,_float>.x = in_stack_fffffffffffffca8;
  v_00.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffcb0;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_fffffffffffffc90;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)i;
  VVar13.super_Tuple3<pbrt::Vector3,_float>.y = (float)(int)(i >> 0x20);
  Vector3fi::Vector3fi(this_00,v_00,VVar13);
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU inline Vector3fi Transform::operator()(const Vector3fi &v) const {
    Float x = Float(v.x), y = Float(v.y), z = Float(v.z);
    Vector3f vOutError;
    if (v.IsExact()) {
        vOutError.x = gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    } else {
        Vector3f vInError = v.Error();
        vOutError.x = (gamma(3) + 1) * (std::abs(m[0][0]) * vInError.x +
                                        std::abs(m[0][1]) * vInError.y +
                                        std::abs(m[0][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[0][0] * x) + std::abs(m[0][1] * y) +
                                  std::abs(m[0][2] * z));
        vOutError.y = (gamma(3) + 1) * (std::abs(m[1][0]) * vInError.x +
                                        std::abs(m[1][1]) * vInError.y +
                                        std::abs(m[1][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[1][0] * x) + std::abs(m[1][1] * y) +
                                  std::abs(m[1][2] * z));
        vOutError.z = (gamma(3) + 1) * (std::abs(m[2][0]) * vInError.x +
                                        std::abs(m[2][1]) * vInError.y +
                                        std::abs(m[2][2]) * vInError.z) +
                      gamma(3) * (std::abs(m[2][0] * x) + std::abs(m[2][1] * y) +
                                  std::abs(m[2][2] * z));
    }

    Float xp = m[0][0] * x + m[0][1] * y + m[0][2] * z;
    Float yp = m[1][0] * x + m[1][1] * y + m[1][2] * z;
    Float zp = m[2][0] * x + m[2][1] * y + m[2][2] * z;

    return Vector3fi(Vector3f(xp, yp, zp), vOutError);
}